

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PopStyleColor(int count)

{
  ImVec4 *pIVar1;
  ImVec4 *pIVar2;
  ImGuiColorMod *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImGuiContext *pIVar7;
  long lVar8;
  int iVar9;
  
  pIVar7 = GImGui;
  iVar9 = (GImGui->ColorStack).Size;
  if (iVar9 < count) {
    count = iVar9;
  }
  if (0 < count) {
    iVar9 = count + 1;
    do {
      pIVar3 = (pIVar7->ColorStack).Data;
      lVar8 = (long)(pIVar7->ColorStack).Size;
      pIVar2 = &pIVar3[lVar8 + -1].BackupValue;
      fVar4 = pIVar2->y;
      fVar5 = pIVar2->z;
      fVar6 = pIVar2->w;
      pIVar1 = (pIVar7->Style).Colors + pIVar3[lVar8 + -1].Col;
      pIVar1->x = pIVar2->x;
      pIVar1->y = fVar4;
      pIVar1->z = fVar5;
      pIVar1->w = fVar6;
      (pIVar7->ColorStack).Size = (pIVar7->ColorStack).Size + -1;
      iVar9 = iVar9 + -1;
    } while (1 < iVar9);
  }
  return;
}

Assistant:

void ImGui::PopStyleColor(int count)
{
    ImGuiContext& g = *GImGui;
    if (g.ColorStack.Size < count)
    {
        IM_ASSERT_USER_ERROR(g.ColorStack.Size > count, "Calling PopStyleColor() too many times: stack underflow.");
        count = g.ColorStack.Size;
    }
    while (count > 0)
    {
        ImGuiColorMod& backup = g.ColorStack.back();
        g.Style.Colors[backup.Col] = backup.BackupValue;
        g.ColorStack.pop_back();
        count--;
    }
}